

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t _elemsize;
  _func_int *p_Var6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  _func_int **pp_Var10;
  Layer *pLVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  void *pvVar17;
  int iVar18;
  int iVar19;
  uint _w;
  undefined4 *puVar20;
  long lVar21;
  int iVar22;
  undefined4 *puVar23;
  void *pvVar24;
  ulong uVar25;
  ulong uVar26;
  uint _h;
  undefined4 *puVar27;
  bool bVar28;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  Option opt_g;
  long local_188;
  long local_170;
  Mat local_168;
  Mat local_118;
  long local_c8;
  long local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  undefined4 local_78;
  int iStack_74;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var6 = this->_vptr_Convolution_x86[-3];
  iVar3 = *(int *)(p_Var6 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
  iVar4 = *(int *)(p_Var6 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
  uVar5 = *(uint *)(p_Var6 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
  uVar15 = (ulong)uVar5;
  iVar19 = (iVar3 + -1) * uVar5 + 1;
  iVar14 = (iVar1 - iVar19) / iVar4;
  iVar18 = iVar14 + 1;
  Mat::create(top_blob,iVar18,(iVar2 - iVar19) / iVar4 + 1,
              *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data),_elemsize,
              opt->blob_allocator);
  iVar19 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    bVar28 = 0 < (int)uVar5;
    if (0 < (int)uVar5) {
      local_c0 = (long)iVar1 << 2;
      local_c8 = (long)iVar14 * 4 + 4;
      local_80 = (long)(int)(iVar18 * uVar5) << 2;
      local_188 = 0;
      local_170 = 0;
      uVar25 = 0;
      do {
        uVar12 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar25) / (long)(int)uVar5;
        iVar14 = (int)uVar12;
        uVar16 = (long)(iVar14 - iVar3) / (long)iVar4;
        local_98 = uVar16 & 0xffffffff;
        _h = (int)uVar16 + 1;
        uVar16 = 0;
        local_b8 = uVar25;
        local_b0 = local_170;
        local_a8 = local_188;
        do {
          uVar25 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar16) / (long)(int)uVar5;
          iVar18 = (int)uVar25;
          iVar19 = (iVar18 - iVar3) / iVar4;
          local_a0 = uVar16;
          Mat::create(&local_118,iVar18,iVar14,bottom_blob->c,_elemsize,opt->workspace_allocator);
          if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0)) {
LAB_00173686:
            iVar19 = -100;
            if (bVar28) goto LAB_001736b2;
            goto LAB_00173692;
          }
          _w = iVar19 + 1;
          Mat::create(&local_168,_w,_h,
                      *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                              (long)&(this->weight_data_3x3_winograd63).data),_elemsize,
                      opt->workspace_allocator);
          if ((local_168.data == (void *)0x0) || ((long)local_168.c * local_168.cstep == 0))
          goto LAB_00173686;
          local_88 = (long)bottom_blob->c;
          if (0 < local_88) {
            local_90 = local_118.cstep *
                       CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
            lVar21 = 0;
            pvVar17 = local_118.data;
            do {
              if (0 < iVar14) {
                sVar7 = bottom_blob->cstep;
                pvVar8 = bottom_blob->data;
                sVar9 = bottom_blob->elemsize;
                iVar22 = 0;
                uVar16 = 0;
                pvVar24 = pvVar17;
                do {
                  if (0 < iVar18) {
                    puVar20 = (undefined4 *)
                              ((long)pvVar8 + (long)iVar22 * 4 + sVar7 * sVar9 * lVar21 + local_170)
                    ;
                    uVar26 = 0;
                    do {
                      *(undefined4 *)((long)pvVar24 + uVar26 * 4) = *puVar20;
                      uVar26 = uVar26 + 1;
                      puVar20 = puVar20 + uVar15;
                    } while ((uVar25 & 0xffffffff) != uVar26);
                  }
                  uVar16 = uVar16 + 1;
                  iVar22 = iVar22 + uVar5 * iVar1;
                  pvVar24 = (void *)((long)pvVar24 + (long)iVar18 * 4);
                } while (uVar16 != (uVar12 & 0xffffffff));
              }
              lVar21 = lVar21 + 1;
              pvVar17 = (void *)((long)pvVar17 + local_90);
            } while (lVar21 != local_88);
          }
          local_78 = *(undefined4 *)opt;
          iStack_74 = opt->num_threads;
          local_68 = *(undefined4 *)&opt->workspace_allocator;
          uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
          iStack_60 = opt->openmp_blocktime;
          uStack_5c._0_1_ = opt->use_winograd_convolution;
          uStack_5c._1_1_ = opt->use_sgemm_convolution;
          uStack_5c._2_1_ = opt->use_int8_inference;
          uStack_5c._3_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          uStack_54._0_1_ = opt->use_int8_packed;
          uStack_54._1_1_ = opt->use_int8_storage;
          uStack_54._2_1_ = opt->use_int8_arithmetic;
          uStack_54._3_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_4c._0_1_ = opt->use_subgroup_shuffle;
          uStack_4c._1_1_ = opt->use_image_storage;
          uStack_4c._2_1_ = opt->use_tensor_storage;
          uStack_4c._3_1_ = opt->use_weight_fp16_storage;
          local_48 = opt->flush_denormals;
          uStack_44._0_1_ = opt->use_local_pool_allocator;
          uStack_44._1_1_ = opt->use_reserved_1;
          uStack_44._2_1_ = opt->use_reserved_2;
          uStack_44._3_1_ = opt->use_reserved_3;
          uStack_40._0_1_ = opt->use_reserved_4;
          uStack_40._1_1_ = opt->use_reserved_5;
          uStack_40._2_1_ = opt->use_reserved_6;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_3c._0_1_ = opt->use_reserved_8;
          uStack_3c._1_1_ = opt->use_reserved_9;
          uStack_3c._2_1_ = opt->use_reserved_10;
          uStack_3c._3_1_ = opt->use_reserved_11;
          pAStack_70 = local_168.allocator;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_118,&local_168,&local_78);
          pp_Var10 = this->_vptr_Convolution_x86;
          if (0 < *(int *)(pp_Var10[-3] + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
            sVar7 = top_blob->cstep;
            sVar9 = top_blob->elemsize;
            puVar20 = (undefined4 *)((long)top_blob->data + local_188);
            lVar21 = 0;
            do {
              if (-1 < (int)local_98) {
                pvVar17 = (void *)(local_168.cstep *
                                   CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
                                   * lVar21 + (long)local_168.data);
                uVar25 = 0;
                puVar23 = puVar20;
                do {
                  if (-1 < iVar19) {
                    uVar16 = 0;
                    puVar27 = puVar23;
                    do {
                      *puVar27 = *(undefined4 *)((long)pvVar17 + uVar16 * 4);
                      uVar16 = uVar16 + 1;
                      puVar27 = puVar27 + uVar15;
                    } while (_w != uVar16);
                  }
                  uVar25 = uVar25 + 1;
                  puVar23 = (undefined4 *)((long)puVar23 + local_80);
                  pvVar17 = (void *)((long)pvVar17 + (long)(int)_w * 4);
                } while (uVar25 != _h);
              }
              lVar21 = lVar21 + 1;
              puVar20 = (undefined4 *)((long)puVar20 + sVar7 * sVar9);
            } while (lVar21 < *(int *)(pp_Var10[-3] + 0x30 +
                                      (long)&(this->weight_data_3x3_winograd63).data));
          }
          uVar16 = local_a0 + 1;
          local_170 = local_170 + 4;
          local_188 = local_188 + 4;
        } while (uVar16 != uVar15);
        uVar25 = local_b8 + 1;
        bVar28 = uVar25 < uVar15;
        local_170 = local_b0 + local_c0;
        local_188 = local_a8 + local_c8;
      } while (uVar25 != uVar15);
    }
LAB_00173692:
    pLVar11 = this->activation;
    if (pLVar11 == (Layer *)0x0) {
      iVar19 = 0;
    }
    else {
      (*pLVar11->_vptr_Layer[9])(pLVar11,top_blob,opt);
      iVar19 = 0;
    }
LAB_001736b2:
    piVar13 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar19;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}